

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

monster_race * get_mon_num(wchar_t generated_level,wchar_t current_level)

{
  int iVar1;
  alloc_entry *table;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  tm *ptVar5;
  monster_race *pmVar6;
  monster_race *pmVar7;
  monster_race *old;
  bitflag *flags;
  long lVar8;
  int *piVar9;
  long local_50;
  time_t cur_time;
  
  table = alloc_race_table;
  cur_time = time((time_t *)0x0);
  ptVar5 = localtime(&cur_time);
  if ((L'\0' < generated_level) && (uVar3 = Rand_div((uint)z_info->ood_monster_chance), uVar3 == 0))
  {
    uVar4 = ((uint)generated_level >> 2) + 2;
    if (z_info->ood_monster_amount <= uVar4) {
      uVar4 = (uint)z_info->ood_monster_amount;
    }
    generated_level = generated_level + uVar4;
  }
  lVar8 = 0;
  local_50 = 0;
  for (piVar9 = &table->prob3; (lVar8 < alloc_race_size && (piVar9[-3] <= generated_level));
      piVar9 = piVar9 + 5) {
    *piVar9 = 0;
    pmVar6 = r_info;
    if ((generated_level < L'\x01') || (L'\0' < piVar9[-3])) {
      iVar1 = ((alloc_entry *)(piVar9 + -4))->index;
      flags = r_info[iVar1].flags;
      _Var2 = flag_has_dbg(flags,0xb,0xf,"race->flags","RF_SEASONAL");
      if ((!_Var2) || ((ptVar5->tm_mon == 0xb && (ptVar5->tm_mday - 0x18U < 3)))) {
        _Var2 = flag_has_dbg(flags,0xb,1,"race->flags","RF_UNIQUE");
        if (((!_Var2) || (pmVar6[iVar1].cur_num < (int)(uint)pmVar6[iVar1].max_num)) &&
           ((_Var2 = flag_has_dbg(flags,0xb,0xc,"race->flags","RF_FORCE_DEPTH"), !_Var2 ||
            (pmVar6[iVar1].level <= current_level)))) {
          *piVar9 = piVar9[-1];
          local_50 = local_50 + piVar9[-1];
        }
      }
    }
    lVar8 = lVar8 + 1;
  }
  if (local_50 < 1) {
    pmVar6 = (monster_race *)0x0;
  }
  else {
    pmVar6 = get_mon_race_aux(local_50,table);
    uVar3 = Rand_div(100);
    if ((int)uVar3 < 0x3c) {
      pmVar7 = get_mon_race_aux(local_50,table);
      if (pmVar6->level <= pmVar7->level) {
        pmVar6 = pmVar7;
      }
      if (((int)uVar3 < 10) &&
         (pmVar7 = get_mon_race_aux(local_50,table), pmVar6->level <= pmVar7->level)) {
        pmVar6 = pmVar7;
      }
    }
  }
  return pmVar6;
}

Assistant:

struct monster_race *get_mon_num(int generated_level, int current_level)
{
	int i, p;
	long total;
	struct monster_race *race;
	alloc_entry *table = alloc_race_table;
	time_t cur_time = time(NULL);
	struct tm *date = localtime(&cur_time);

	/* Occasionally produce a nastier monster in the dungeon */
	if (generated_level > 0 && one_in_(z_info->ood_monster_chance))
		generated_level += MIN(generated_level / 4 + 2,
			z_info->ood_monster_amount);

	total = 0L;

	/* Process probabilities */
	for (i = 0; i < alloc_race_size; i++) {
		/* Monsters are sorted by depth */
		if (table[i].level > generated_level) break;

		/* Default */
		table[i].prob3 = 0;

		/* No town monsters in dungeon */
		if (generated_level > 0 && table[i].level <= 0) continue;

		/* Get the chosen monster */
		race = &r_info[table[i].index];

		/* No seasonal monsters outside of Christmas */
		if (rf_has(race->flags, RF_SEASONAL) &&
			!(date->tm_mon == 11 && date->tm_mday >= 24 && date->tm_mday <= 26))
			continue;

		/* Only one copy of a unique must be around at the same time */
		if (rf_has(race->flags, RF_UNIQUE) && (race->cur_num >= race->max_num))
			continue;

		/* Some monsters never appear out of depth */
		if (rf_has(race->flags, RF_FORCE_DEPTH) && race->level > current_level)
			continue;

		/* Accept */
		table[i].prob3 = table[i].prob2;

		/* Total */
		total += table[i].prob3;
	}

	/* No legal monsters */
	if (total <= 0) return NULL;

	/* Pick a monster */
	race = get_mon_race_aux(total, table);

	/* Try for a "harder" monster once (50%) or twice (10%) */
	p = randint0(100);

	if (p < 60) {
		struct monster_race *old = race;

		/* Pick a new monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Try for a "harder" monster twice (10%) */
	if (p < 10) {
		struct monster_race *old = race;

		/* Pick a monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Result */
	return race;
}